

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

char * soul::heart::ProcessorProperty::getPropertyName(Property p)

{
  if (p - period < 5) {
    return &DAT_00257974 + *(int *)(&DAT_00257974 + (ulong)(p - period) * 4);
  }
  throwInternalCompilerError("getPropertyName",0x569);
}

Assistant:

static const char* getPropertyName (Property p)
        {
            if (p == Property::period)     return "period";
            if (p == Property::frequency)  return "frequency";
            if (p == Property::id)         return "id";
            if (p == Property::session)    return "session";
            if (p == Property::latency)    return "latency";

            SOUL_ASSERT_FALSE;
            return "";
        }